

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_5e4c5e::Db::consumeIf(Db *this,StringView S)

{
  char *__s2;
  int iVar1;
  char *__s1;
  ulong __n;
  bool bVar2;
  
  __s1 = S.First;
  __s2 = this->First;
  __n = (long)S.Last - (long)__s1;
  if ((ulong)((long)this->Last - (long)__s2) < __n) {
    bVar2 = false;
  }
  else if (S.Last == __s1) {
    bVar2 = true;
  }
  else {
    iVar1 = bcmp(__s1,__s2,__n);
    bVar2 = iVar1 == 0;
  }
  if (bVar2 != false) {
    this->First = __s2 + __n;
  }
  return bVar2;
}

Assistant:

bool consumeIf(StringView S) {
    if (StringView(First, Last).startsWith(S)) {
      First += S.size();
      return true;
    }
    return false;
  }